

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-attack.c
# Opt level: O0

wchar_t o_ranged_damage(player *p,monster *mon,object *missile,object *launcher,wchar_t b,wchar_t s,
                       uint32_t *msg_type)

{
  _Bool _Var1;
  int16_t iVar2;
  wchar_t wVar3;
  uint32_t uVar4;
  int iVar5;
  wchar_t local_5c;
  wchar_t local_58;
  int local_50;
  wchar_t bmult;
  wchar_t die_average;
  _Bool extra;
  wchar_t add;
  wchar_t dmg;
  wchar_t deadliness;
  wchar_t sides;
  wchar_t dice;
  wchar_t mult;
  wchar_t s_local;
  wchar_t b_local;
  object *launcher_local;
  object *missile_local;
  monster *mon_local;
  player *p_local;
  
  if (launcher == (object *)0x0) {
    local_58 = L'\x01';
  }
  else {
    local_58 = (p->state).ammo_mult;
  }
  sides = local_58;
  deadliness = (wchar_t)missile->dd;
  die_average = L'\0';
  local_50 = local_58 * (((missile->ds + 1) * 10) / 2);
  dice = s;
  mult = b;
  _s_local = launcher;
  launcher_local = missile;
  missile_local = (object *)mon;
  mon_local = (monster *)p;
  if (b == L'\0') {
    if (s == L'\0') {
      local_50 = local_50 * 10;
    }
    else {
      local_50 = slays[s].o_multiplier * local_50;
      die_average = slays[s].o_multiplier + L'\xfffffff6';
    }
  }
  else {
    wVar3 = get_monster_brand_multiplier(mon,brands + b,true);
    local_50 = wVar3 * local_50;
    die_average = wVar3 + L'\xfffffff6';
  }
  add = object_to_dam(launcher_local);
  if (_s_local == (object *)0x0) {
    _Var1 = flag_has_dbg(launcher_local->flags,5,0x25,"missile->flags","OF_THROWING");
    if (_Var1) {
      add = (int)mon_local[1].known_pstate.el_info[9] + add;
    }
  }
  else {
    wVar3 = object_to_dam(_s_local);
    add = wVar3 + (int)mon_local[1].known_pstate.el_info[9] + add;
  }
  if (add < L'\x97') {
    local_5c = add;
  }
  else {
    local_5c = L'\x96';
  }
  apply_deadliness(&local_50,local_5c);
  dmg = local_50 * 2 + L'\xffffd8f0';
  uVar4 = Rand_div(10000);
  bmult._3_1_ = (int)uVar4 < dmg % 10000;
  dmg = (uint)(byte)bmult._3_1_ + dmg / 10000;
  if (_s_local == (object *)0x0) {
    _Var1 = flag_has_dbg(launcher_local->flags,5,0x25,"missile->flags","OF_THROWING");
    if (_Var1) {
      wVar3 = o_critical_shot((player *)mon_local,(monster *)missile_local,launcher_local,
                              (object *)0x0,msg_type);
      deadliness = wVar3 + deadliness;
      iVar2 = object_weight_one(launcher_local);
      deadliness = ((int)iVar2 / 0xc + 2) * deadliness;
    }
  }
  else {
    wVar3 = o_critical_shot((player *)mon_local,(monster *)missile_local,launcher_local,_s_local,
                            msg_type);
    deadliness = wVar3 + deadliness;
  }
  iVar5 = damroll(deadliness,dmg);
  return die_average + iVar5;
}

Assistant:

static int o_ranged_damage(struct player *p, const struct monster *mon,
		struct object *missile, struct object *launcher,
		int b, int s, uint32_t *msg_type)
{
	int mult = (launcher ? p->state.ammo_mult : 1);
	int dice = missile->dd;
	int sides, deadliness, dmg, add = 0;
	bool extra;

	/* Get the average value of a single damage die. (x10) */
	int die_average = (10 * (missile->ds + 1)) / 2;

	/* Apply the launcher multiplier. */
	die_average *= mult;

	/* Adjust the average for slays and brands. (10x inflation) */
	if (b) {
		int bmult = get_monster_brand_multiplier(mon, &brands[b], true);

		die_average *= bmult;
		add = bmult - 10;
	} else if (s) {
		die_average *= slays[s].o_multiplier;
		add = slays[s].o_multiplier - 10;
	} else {
		die_average *= 10;
	}

	/* Apply deadliness to average. (100x inflation) */
	deadliness = object_to_dam(missile);
	if (launcher) {
		deadliness += object_to_dam(launcher) + p->state.to_d;
	} else if (of_has(missile->flags, OF_THROWING)) {
		deadliness += p->state.to_d;
	}
	apply_deadliness(&die_average, MIN(deadliness, 150));

	/* Calculate the actual number of sides to each die. */
	sides = (2 * die_average) - 10000;
	extra = randint0(10000) < (sides % 10000);
	sides /= 10000;
	sides += (extra ? 1 : 0);

	/* Get number of critical dice - only for suitable objects */
	if (launcher) {
		dice += o_critical_shot(p, mon, missile, launcher, msg_type);
	} else if (of_has(missile->flags, OF_THROWING)) {
		dice += o_critical_shot(p, mon, missile, NULL, msg_type);

		/* Multiply the number of damage dice by the throwing weapon
		 * multiplier.  This is not the prettiest equation,
		 * but it does at least try to keep throwing weapons competitive. */
		dice *= 2 + object_weight_one(missile) / 12;
	}

	/* Roll out the damage. */
	dmg = damroll(dice, sides);

	/* Apply any special additions to damage. */
	dmg += add;

	return dmg;
}